

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_factory.cc
# Opt level: O3

shared_ptr<spdlog::logger> * lf::mesh::hybrid2d::MeshFactory::Logger(void)

{
  int iVar1;
  string local_30;
  
  if (Logger()::logger == '\0') {
    iVar1 = __cxa_guard_acquire(&Logger()::logger);
    if (iVar1 != 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_30,"lf::mesh::hybrid2d::MeshFactory::Logger","");
      base::InitLogger((base *)&Logger::logger,&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
      __cxa_atexit(std::__shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>::~__shared_ptr,
                   &Logger::logger,&__dso_handle);
      __cxa_guard_release(&Logger()::logger);
    }
  }
  return &Logger::logger;
}

Assistant:

std::shared_ptr<spdlog::logger>& MeshFactory::Logger() {
  static auto logger =
      lf::base::InitLogger("lf::mesh::hybrid2d::MeshFactory::Logger");
  return logger;
}